

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

void __thiscall
cppgenerate::Class::printConstructors
          (Class *this,ostream *stream,AccessModifier modifier,bool signatureOnly)

{
  pointer pCVar1;
  AccessModifier AVar2;
  ostream *poVar3;
  pointer other;
  bool bVar4;
  string accessString;
  Constructor constructor;
  
  accessString._M_dataplus._M_p = (pointer)&accessString.field_2;
  accessString._M_string_length = 0;
  accessString.field_2._M_local_buf[0] = '\0';
  if (modifier < (PROTECTED|PRIVATE)) {
    std::__cxx11::string::assign((char *)&accessString);
  }
  pCVar1 = (this->m_constructors).
           super__Vector_base<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  for (other = (this->m_constructors).
               super__Vector_base<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>
               ._M_impl.super__Vector_impl_data._M_start; other != pCVar1; other = other + 1) {
    Constructor::Constructor(&constructor,other);
    AVar2 = Constructor::accessModifier(&constructor);
    if (AVar2 == modifier) {
      if (!bVar4) {
        poVar3 = std::operator<<(stream,(string *)&accessString);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      if (signatureOnly) {
        bVar4 = true;
        Constructor::printSignature(&constructor,this,stream,false);
      }
      else {
        bVar4 = true;
        Constructor::printImplementation(&constructor,this,stream,true);
      }
    }
    Constructor::~Constructor(&constructor);
  }
  std::__cxx11::string::~string((string *)&accessString);
  return;
}

Assistant:

void Class::printConstructors( std::ostream& stream, AccessModifier modifier, bool signatureOnly ) const{
    bool havePrinted = false;
    std::string accessString;

    switch( modifier ){
    case cppgenerate::AccessModifier::PRIVATE: accessString = "private:"; break;
    case cppgenerate::AccessModifier::PUBLIC: accessString = "public:"; break;
    case cppgenerate::AccessModifier::PROTECTED: accessString = "protected:"; break;
    }

    for( cppgenerate::Constructor constructor : m_constructors ){
        if( constructor.accessModifier() != modifier ) continue;
        if( !havePrinted ){
            stream << accessString << std::endl;
            havePrinted = true;
        }
        if( signatureOnly ){
            constructor.printSignature( this, stream, false );
        }else{
            constructor.printImplementation( this, stream, true );
        }
    }
}